

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

void __thiscall QAbstractSpinBox::changeEvent(QAbstractSpinBox *this,QEvent *event)

{
  short sVar1;
  QAbstractSpinBoxPrivate *this_00;
  QLineEdit *this_01;
  bool bVar2;
  int iVar3;
  KeyboardModifier KVar4;
  QStyle *pQVar5;
  
  this_00 = *(QAbstractSpinBoxPrivate **)(this + 8);
  sVar1 = *(short *)(event + 8);
  if (sVar1 == 0x58) {
    (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0xc0))(this_00);
  }
  else if (sVar1 == 0x62) {
    if ((*(byte *)(*(long *)(this + 0x20) + 8) & 1) != 0) {
      QAbstractSpinBoxPrivate::reset(this_00);
    }
  }
  else if (sVar1 == 99) {
    bVar2 = QWidget::isActiveWindow((QWidget *)this);
    if (!bVar2) {
      QAbstractSpinBoxPrivate::reset(this_00);
      if ((this_00->field_0x3d0 & 1) != 0) {
        (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0xd0))(this_00,0);
      }
    }
  }
  else if (sVar1 == 100) {
    pQVar5 = QWidget::style((QWidget *)this);
    iVar3 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x2c,0,this,0);
    this_00->spinClickTimerInterval = iVar3;
    pQVar5 = QWidget::style((QWidget *)this);
    iVar3 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x53,0,this,0);
    this_00->spinClickThresholdTimerInterval = iVar3;
    this_01 = this_00->edit;
    if (this_01 != (QLineEdit *)0x0) {
      pQVar5 = QWidget::style((QWidget *)this);
      iVar3 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x73,0,this,0);
      QLineEdit::setFrame(this_01,iVar3 == 0);
    }
    pQVar5 = QWidget::style((QWidget *)this);
    KVar4 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x74,0,this,0);
    this_00->stepModifier = KVar4;
    QAbstractSpinBoxPrivate::reset(this_00);
    (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0x100))(this_00);
  }
  QWidget::changeEvent((QWidget *)this,event);
  return;
}

Assistant:

void QAbstractSpinBox::changeEvent(QEvent *event)
{
    Q_D(QAbstractSpinBox);

    switch (event->type()) {
        case QEvent::StyleChange:
            d->spinClickTimerInterval = style()->styleHint(QStyle::SH_SpinBox_ClickAutoRepeatRate, nullptr, this);
            d->spinClickThresholdTimerInterval =
                style()->styleHint(QStyle::SH_SpinBox_ClickAutoRepeatThreshold, nullptr, this);
            if (d->edit)
                d->edit->setFrame(!style()->styleHint(QStyle::SH_SpinBox_ButtonsInsideFrame, nullptr, this));
            d->stepModifier = static_cast<Qt::KeyboardModifier>(style()->styleHint(QStyle::SH_SpinBox_StepModifier, nullptr, this));
            d->reset();
            d->updateEditFieldGeometry();
            break;
        case QEvent::LocaleChange:
            d->updateEdit();
            break;
        case QEvent::EnabledChange:
            if (!isEnabled()) {
                d->reset();
            }
            break;
        case QEvent::ActivationChange:
            if (!isActiveWindow()){
                d->reset();
                if (d->pendingEmit) // pendingEmit can be true even if it hasn't changed.
                    d->interpret(EmitIfChanged); // E.g. 10 to 10.0
            }
            break;
        default:
            break;
    }
    QWidget::changeEvent(event);
}